

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

bool tinyxml2::XMLUtil::ToInt(char *str,int *value)

{
  bool bVar1;
  int iVar2;
  undefined8 in_RAX;
  uint v;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  bVar1 = IsPrefixHex(str);
  if (bVar1) {
    iVar2 = __isoc99_sscanf(str,"%x",&local_14);
    if (iVar2 == 1) {
      *value = local_14;
      return true;
    }
  }
  else {
    iVar2 = __isoc99_sscanf(str,"%d",value);
    if (iVar2 == 1) {
      return true;
    }
  }
  return false;
}

Assistant:

bool XMLUtil::ToInt(const char* str, int* value)
{
    if (IsPrefixHex(str)) {
        unsigned v;
        if (TIXML_SSCANF(str, "%x", &v) == 1) {
            *value = static_cast<int>(v);
            return true;
        }
    }
    else {
        if (TIXML_SSCANF(str, "%d", value) == 1) {
            return true;
        }
    }
    return false;
}